

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void readRgba1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  Rgba *pRVar2;
  int *in_RCX;
  int *in_RDX;
  Array2D<Imf_3_2::Rgba> *in_RSI;
  char *in_RDI;
  Box2i dw;
  RgbaInputFile file;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff58;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff60;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  Rgba local_60 [2];
  long in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffffc0;
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_60,in_RDI,iVar1);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *in_RDX = (local_68 - local_70) + 1;
  *in_RCX = (local_64 - local_6c) + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pRVar2 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RSI,0);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_60,(ulong)(pRVar2 + (-(long)local_70 - (long)(local_6c * *in_RDX))),1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_60,local_6c);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_60);
  return;
}

Assistant:

void
readRgba1 (
    const char fileName[], Array2D<Rgba>& pixels, int& width, int& height)
{
    //
    // Read an RGBA image using class RgbaInputFile:
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    RgbaInputFile file (fileName);
    Box2i         dw = file.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}